

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_lagout(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *ch_00;
  char arg [4608];
  
  one_argument(argument,arg);
  if ((arg[0] != '\0') && (*argument != '\0')) {
    ch_00 = get_char_world(ch,arg);
    if (ch_00 != (CHAR_DATA *)0x0) {
      WAIT_STATE(ch_00,0x18);
    }
  }
  return;
}

Assistant:

void do_lagout(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);
	if (arg[0] == '\0' || argument[0] == '\0')
	{
		return;
	}

	victim = get_char_world(ch, arg);
	if (victim == nullptr)
		return;

	WAIT_STATE(victim, 24);
}